

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

string * __thiscall
testing::internal::
DefaultParamName<std::tuple<std::tuple<void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),int>,unsigned_char>>
          (string *__return_storage_ptr__,internal *this,
          TestParamInfo<std::tuple<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>,_unsigned_char>_>
          *info)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  Message::Message((Message *)&local_20);
  std::ostream::_M_insert<unsigned_long>((ulong)(local_20._M_head_impl + 0x10));
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&local_20);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  Message name_stream;
  name_stream << info.index;
  return name_stream.GetString();
}